

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

s3pid_t mdef_phone_id(mdef_t *m,s3cipid_t ci,s3cipid_t lc,s3cipid_t rc,word_posn_t wpos)

{
  short sVar1;
  int iVar2;
  ph_lc_t *lcptr;
  ph_lc_t *ppVar3;
  short sVar4;
  short sVar5;
  bool bVar6;
  
  do {
    sVar4 = rc;
    if (m == (mdef_t *)0x0) {
      __assert_fail("m",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x12a,
                    "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)")
      ;
    }
    if ((ci < 0) || (iVar2 = m->n_ciphone, iVar2 <= ci)) {
      __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,299,
                    "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)")
      ;
    }
    if ((lc < 0) || (iVar2 <= lc)) {
      __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,300,
                    "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)")
      ;
    }
    if ((sVar4 < 0) || (iVar2 <= sVar4)) {
      __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x12d,
                    "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)")
      ;
    }
    if (WORD_POSN_SINGLE < wpos) {
      __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x12e,
                    "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)")
      ;
    }
    for (ppVar3 = m->wpos_ci_lclist[wpos][(uint)(int)ci];
        (ppVar3 != (ph_lc_t *)0x0 && (ppVar3->lc != lc)); ppVar3 = ppVar3->next) {
    }
    if (ppVar3 != (ph_lc_t *)0x0) {
      do {
        ppVar3 = (ph_lc_t *)ppVar3->rclist;
        if (ppVar3 == (ph_lc_t *)0x0) break;
      } while (ppVar3->lc != sVar4);
      if (ppVar3 != (ph_lc_t *)0x0) {
        return *(s3pid_t *)&ppVar3->field_0x4;
      }
    }
    sVar1 = m->sil;
    if (sVar1 < 0) {
      return -1;
    }
    sVar5 = sVar1;
    if (m->ciphone[(uint)(int)lc].filler == 0) {
      sVar5 = lc;
    }
    rc = sVar4;
    if (m->ciphone[(uint)(int)sVar4].filler != 0) {
      rc = sVar1;
    }
    bVar6 = sVar5 == lc;
    lc = sVar5;
    if ((bVar6) && (rc == sVar4)) {
      return -1;
    }
  } while( true );
}

Assistant:

s3pid_t
mdef_phone_id(mdef_t * m,
              s3cipid_t ci, s3cipid_t lc, s3cipid_t rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    s3cipid_t newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (NOT_S3CIPID(m->sil))
            return BAD_S3PID;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return BAD_S3PID;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}